

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void FastPForLib::checkifdivisibleby(size_t a,uint32_t x)

{
  logic_error *this;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string msg;
  
  if (a % (ulong)x == 0) {
    return;
  }
  std::__cxx11::to_string(&local_50,a);
  std::operator+(&local_70,&local_50," not divisible by ");
  std::__cxx11::to_string(&local_90,x);
  std::operator+(&msg,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,(string *)&msg);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline void checkifdivisibleby(size_t a, uint32_t x) {
  if (!divisibleby(a, x)) {
    std::string msg = std::to_string(a) + " not divisible by "
                    + std::to_string(x);
    throw std::logic_error(msg);
  }
}